

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

ssize_t zip_stream_copy(zip_t *zip,void **buf,size_t *bufsize)

{
  void *pvVar1;
  size_t n;
  size_t *bufsize_local;
  void **buf_local;
  zip_t *zip_local;
  
  if (zip == (zip_t *)0x0) {
    zip_local = (zip_t *)0xffffffffffffffff;
  }
  else {
    zip_archive_finalize(&zip->archive);
    zip_local = (zip_t *)(zip->archive).m_archive_size;
    if (bufsize != (size_t *)0x0) {
      *bufsize = (size_t)zip_local;
    }
    pvVar1 = calloc((size_t)zip_local,1);
    *buf = pvVar1;
    memcpy(*buf,((zip->archive).m_pState)->m_pMem,(size_t)zip_local);
  }
  return (ssize_t)zip_local;
}

Assistant:

ssize_t zip_stream_copy(struct zip_t *zip, void **buf, size_t *bufsize) {
  size_t n;

  if (!zip) {
    return (ssize_t)ZIP_ENOINIT;
  }
  zip_archive_finalize(&(zip->archive));

  n = (size_t)zip->archive.m_archive_size;
  if (bufsize != NULL) {
    *bufsize = n;
  }

  *buf = calloc(n, sizeof(unsigned char));
  memcpy(*buf, zip->archive.m_pState->m_pMem, n);

  return (ssize_t)n;
}